

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void AddFixedArrayField(FMFieldList *FieldP,int *CountP,char *Name,int Type,int ElementSize,
                       int DimCount)

{
  char *__s;
  size_t sVar1;
  char *__s_00;
  undefined4 in_ECX;
  int *in_RDX;
  FMFieldList *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  uint in_R9D;
  char *TypeWithArray;
  char *TransType;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd8;
  
  __s = TranslateADIOS2Type2FFS(in_stack_ffffffffffffffbc);
  sVar1 = strlen(__s);
  __s_00 = (char *)malloc(sVar1 + 0x10);
  sVar1 = strlen(__s);
  snprintf(__s_00,sVar1 + 0x10,"*(%s[%d])",__s,(ulong)in_R9D);
  free(__s);
  AddSimpleField(in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_R8D),
                 (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),(int)((ulong)__s >> 0x20));
  free(__s_00);
  *(undefined4 *)(*in_RDI + (long)(*(int *)in_RSI + -1) * 0x18 + 0x10) = in_R8D;
  return;
}

Assistant:

static void AddFixedArrayField(FMFieldList *FieldP, int *CountP, const char *Name, const int Type,
                               int ElementSize, int DimCount)
{
    const char *TransType = TranslateADIOS2Type2FFS(Type);
    char *TypeWithArray = malloc(strlen(TransType) + 16);
    snprintf(TypeWithArray, strlen(TransType) + 16, "*(%s[%d])", TransType, DimCount);
    free((void *)TransType);
    AddSimpleField(FieldP, CountP, Name, TypeWithArray, sizeof(void *));
    free(TypeWithArray);
    (*FieldP)[*CountP - 1].field_size = ElementSize;
}